

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall diligent_spirv_cross::ParsedIR::reset_all_of_type(ParsedIR *this,Types type)

{
  uint32_t uVar1;
  Types TVar2;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  TypedID<(diligent_spirv_cross::Types)0> *id;
  TypedID<(diligent_spirv_cross::Types)0> *__end1;
  TypedID<(diligent_spirv_cross::Types)0> *__begin1;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *__range1;
  Types type_local;
  ParsedIR *this_local;
  
  __end1 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::begin
                     (&this->ids_for_type[type].
                       super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                     );
  pTVar3 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::end
                     (&this->ids_for_type[type].
                       super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                     );
  for (; __end1 != pTVar3; __end1 = __end1 + 1) {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    pVVar4 = VectorView<diligent_spirv_cross::Variant>::operator[]
                       (&(this->ids).super_VectorView<diligent_spirv_cross::Variant>,(ulong)uVar1);
    TVar2 = Variant::get_type(pVVar4);
    if (TVar2 == type) {
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
      pVVar4 = VectorView<diligent_spirv_cross::Variant>::operator[]
                         (&(this->ids).super_VectorView<diligent_spirv_cross::Variant>,(ulong)uVar1)
      ;
      Variant::reset(pVVar4);
    }
  }
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::clear
            (this->ids_for_type + type);
  return;
}

Assistant:

void ParsedIR::reset_all_of_type(Types type)
{
	for (auto &id : ids_for_type[type])
		if (ids[id].get_type() == type)
			ids[id].reset();

	ids_for_type[type].clear();
}